

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightBounds * __thiscall
pbrt::LightHandle::Bounds(LightBounds *__return_storage_ptr__,LightHandle *this)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar2 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar3 = (uint)(ushort)(uVar2 >> 0x30);
  if (uVar2 >> 0x30 < 5) {
    if (2 < uVar3) {
      if ((uVar3 & 6) == 2) {
        ProjectionLight::Bounds(__return_storage_ptr__,(ProjectionLight *)(uVar2 & 0xffffffffffff));
        return __return_storage_ptr__;
      }
      GoniometricLight::Bounds(__return_storage_ptr__,(GoniometricLight *)(uVar2 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
    if (uVar3 != 2) {
      PointLight::Bounds(__return_storage_ptr__,(PointLight *)(uVar2 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
    *(undefined4 *)&__return_storage_ptr__->twoSided = 0;
    (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z =
         0xff7fffff7f7fffff;
    auVar4._8_4_ = 0xff7fffff;
    auVar4._0_8_ = 0xff7fffffff7fffff;
    auVar4._12_4_ = 0xff7fffff;
    uVar1 = vmovlps_avx(auVar4);
    (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar1;
    (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z =
         (float)(int)((ulong)uVar1 >> 0x20);
    __return_storage_ptr__->theta_o = 0.0;
    __return_storage_ptr__->theta_e = 0.0;
    (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  }
  else {
    if (uVar3 - 4 < 3) {
      if (uVar3 - 4 == 2) {
        DiffuseAreaLight::Bounds
                  (__return_storage_ptr__,(DiffuseAreaLight *)(uVar2 & 0xffffffffffff));
        return __return_storage_ptr__;
      }
      SpotLight::Bounds(__return_storage_ptr__,(SpotLight *)(uVar2 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
    auVar6._8_4_ = 0xff7fffff;
    auVar6._0_8_ = 0xff7fffffff7fffff;
    auVar6._12_4_ = 0xff7fffff;
    __return_storage_ptr__->theta_o = 0.0;
    __return_storage_ptr__->theta_e = 0.0;
    (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = 0;
    *(undefined4 *)&__return_storage_ptr__->twoSided = 0;
    (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z =
         0xff7fffff7f7fffff;
    uVar1 = vmovlps_avx(auVar6);
    (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar1;
    (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z =
         (float)(int)((ulong)uVar1 >> 0x20);
  }
  auVar5._8_4_ = 0x3f800000;
  auVar5._0_8_ = 0x3f8000003f800000;
  auVar5._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar5);
  __return_storage_ptr__->cosTheta_o = (Float)(int)uVar1;
  __return_storage_ptr__->cosTheta_e = (Float)(int)((ulong)uVar1 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

LightBounds LightHandle::Bounds() const {
    auto bounds = [](auto ptr) { return ptr->Bounds(); };
    return DispatchCPU(bounds);
}